

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSONOutlines(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  allocator<char> local_149;
  string local_148;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_128;
  undefined1 local_110 [8];
  QPDFOutlineDocumentHelper odh;
  JSON j_outlines;
  QPDFObjectHandle oh;
  QPDFPageObjectHelper *ph;
  iterator __end1;
  iterator __begin1;
  QPDFPageDocumentHelper local_a0;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_80;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_68;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  undefined1 local_58 [4];
  int n;
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  page_numbers;
  QPDF *pdf_local;
  bool *first_local;
  Pipeline *p_local;
  QPDFJob *this_local;
  
  page_numbers._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pdf;
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  map((map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
       *)local_58);
  __range1._4_4_ = 0;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            (&local_a0,(QPDF *)page_numbers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  QPDFPageDocumentHelper::getAllPages(&local_80,&local_a0);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_a0);
  local_68 = &local_80;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_68)
  ;
  ph = (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&ph);
    if (!bVar1) break;
    oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            __gnu_cxx::
            __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
            ::operator*(&__end1);
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xffffffffffffff28);
    iVar2 = __range1._4_4_ + 1;
    __range1._4_4_ = iVar2;
    j_outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&stack0xffffffffffffff28);
    pmVar3 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[]((map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                           *)local_58,
                          (key_type *)
                          &j_outlines.m.
                           super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         );
    *pmVar3 = iVar2;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_80);
  JSON::makeArray();
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)local_110,
             (QPDF *)page_numbers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  QPDFOutlineDocumentHelper::getTopLevelOutlines(&local_128,(QPDFOutlineDocumentHelper *)local_110);
  addOutlinesToJson(this,&local_128,
                    (JSON *)&odh.m.
                             super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,
                    (map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                     *)local_58);
  std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
            (&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"outlines",&local_149);
  JSON::writeDictionaryItem
            (p,first,&local_148,
             (JSON *)&odh.m.
                      super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,1);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper((QPDFOutlineDocumentHelper *)local_110);
  JSON::~JSON((JSON *)&odh.m.
                       super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  ~map((map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
        *)local_58);
  return;
}

Assistant:

void
QPDFJob::doJSONOutlines(Pipeline* p, bool& first, QPDF& pdf)
{
    std::map<QPDFObjGen, int> page_numbers;
    int n = 0;
    for (auto const& ph: QPDFPageDocumentHelper(pdf).getAllPages()) {
        QPDFObjectHandle oh = ph.getObjectHandle();
        page_numbers[oh.getObjGen()] = ++n;
    }

    JSON j_outlines = JSON::makeArray();
    QPDFOutlineDocumentHelper odh(pdf);
    addOutlinesToJson(odh.getTopLevelOutlines(), j_outlines, page_numbers);
    JSON::writeDictionaryItem(p, first, "outlines", j_outlines, 1);
}